

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ResultBuilder * __thiscall
Catch::ExpressionLhs<bsim::quad_value_const&>::captureExpression<(Catch::Internal::Operator)0,int>
          (ExpressionLhs<const_bsim::quad_value_&> *this,int *rhs)

{
  bool result;
  char *pcVar1;
  ResultBuilder *pRVar2;
  undefined8 *in_RDI;
  int in_stack_000000dc;
  string *in_stack_ffffffffffffff28;
  ResultBuilder *in_stack_ffffffffffffff30;
  allocator local_81;
  string local_80 [32];
  string local_60 [48];
  string local_30 [48];
  
  pRVar2 = (ResultBuilder *)*in_RDI;
  result = Internal::compare<(Catch::Internal::Operator)0,bsim::quad_value,int>
                     ((quad_value *)in_stack_ffffffffffffff30,(int *)in_stack_ffffffffffffff28);
  ResultBuilder::setResultType(pRVar2,result);
  toString<bsim::quad_value>((quad_value *)in_stack_ffffffffffffff28);
  ResultBuilder::setLhs(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  Catch::toString_abi_cxx11_(in_stack_000000dc);
  ResultBuilder::setRhs(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  pcVar1 = Internal::OperatorTraits<(Catch::Internal::Operator)0>::getName();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,pcVar1,&local_81);
  pRVar2 = ResultBuilder::setOp(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_30);
  return pRVar2;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }